

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdapStrategy.cpp
# Opt level: O2

Url * Vault::LdapStrategy::getUrl(Url *__return_storage_ptr__,Client *client,Path *username)

{
  allocator<char> local_41;
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/v1/auth/ldap/login/",&local_41);
  (*client->_vptr_Client[3])(__return_storage_ptr__,client,local_40,username);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::LdapStrategy::getUrl(const Vault::Client &client,
                                       const Vault::Path &username) {
  return client.getUrl("/v1/auth/ldap/login/", username);
}